

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxUnicode.cpp
# Opt level: O2

WString * Jinx::Impl::ConvertUtf8ToWString(WString *__return_storage_ptr__,String *utf8Str)

{
  size_type __res;
  int iVar1;
  WString *outString;
  pointer utf8In;
  char32_t utf32CodePoint;
  size_t numOut;
  char32_t local_34;
  size_t local_30;
  
  utf8In = (utf8Str->_M_dataplus)._M_p;
  __res = utf8Str->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_Jinx::Allocator<wchar_t>_>::reserve
            (__return_storage_ptr__,__res);
  iVar1 = (int)utf8In;
  local_34 = L'\0';
  local_30 = 0;
  while (*utf8In != '\0') {
    ConvertUtf8ToUtf32(utf8In,(ulong)(uint)(((int)__res + iVar1) - (int)utf8In),&local_34,&local_30)
    ;
    utf8In = utf8In + local_30;
    std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_Jinx::Allocator<wchar_t>_>::
    push_back(__return_storage_ptr__,local_34);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t WString ConvertUtf8ToWString(const String & utf8Str)
	{
		// Compile-time check to determine size of wchar_t, and perform appropriate UTF-16 or UTF-32 conversion.
		if constexpr (sizeof(wchar_t) == 4)
		{
			const char * cInStr = utf8Str.c_str();
			const char * cInStrEnd = cInStr + utf8Str.size();
			WString outString;
			outString.reserve(utf8Str.size());
			char32_t utf32CodePoint = 0;
			size_t numOut = 0;
			while (*cInStr != 0)
			{
				Impl::ConvertUtf8ToUtf32(cInStr, (uint32_t)(cInStrEnd - cInStr), &utf32CodePoint, &numOut);
				cInStr += numOut;
				outString += static_cast<wchar_t>(utf32CodePoint);
			}
			return outString;
		}
		else
		{
			return reinterpret_cast<const wchar_t *>(ConvertUtf8ToUtf16(utf8Str).c_str());
		}
	}